

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

char * evutil_inet_ntop(int af,void *src,char *dst,size_t len)

{
  long lVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  uint16_t words [8];
  char buf [64];
  ushort local_98 [12];
  size_t local_80;
  char local_78 [64];
  undefined1 local_38 [8];
  
  if (af != 10) {
    if (af != 2) {
      return (char *)0x0;
    }
    uVar4 = *src;
    uVar4 = evutil_snprintf(dst,len,"%d.%d.%d.%d",(ulong)(uVar4 & 0xff),
                            (ulong)(((uVar4 & 0xff00) << 8) >> 0x10),
                            (ulong)((uVar4 & 0xff0000) >> 0x10),uVar4 >> 0x18);
    if (len <= uVar4) {
      dst = (char *)0x0;
    }
    if ((int)uVar4 < 0) {
      return (char *)0x0;
    }
    return dst;
  }
  lVar6 = 0;
  do {
    uVar3 = *(ushort *)((long)src + lVar6 * 2);
    local_98[lVar6] = uVar3 << 8 | uVar3 >> 8;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  if ((((local_98[0] == 0) && (local_98[1] == 0)) && (local_98[2] == 0)) &&
     ((local_98[3] == 0 && (local_98[4] == 0)))) {
    if ((local_98[5] == 0xffff) || ((local_98[6] != 0 && local_98[7] != 0) && local_98[5] == 0)) {
      uVar7 = (ulong)*(byte *)((long)src + 0xe);
      bVar2 = *(byte *)((long)src + 0xf);
      if (local_98[5] == 0) {
        pcVar15 = "::%d.%d.%d.%d";
        uVar9 = (ulong)*(byte *)((long)src + 0xc);
        uVar14 = (ulong)*(byte *)((long)src + 0xd);
      }
      else {
        pcVar15 = "::%x:%d.%d.%d.%d";
        uVar9 = (ulong)local_98[5];
        uVar14 = (ulong)*(byte *)((long)src + 0xc);
        uVar7 = (ulong)*(byte *)((long)src + 0xd);
        bVar2 = *(byte *)((long)src + 0xe);
      }
      evutil_snprintf(local_78,0x40,pcVar15,uVar9,uVar14,uVar7,(uint)bVar2);
      uVar7 = strlen(local_78);
      goto LAB_00256162;
    }
  }
  uVar11 = 0xffffffff;
  iVar5 = 0;
  uVar4 = 0;
  do {
    lVar6 = (long)(int)uVar4;
    uVar10 = uVar4 + 1;
    if (local_98[lVar6] == 0) {
      iVar12 = 1;
      if ((int)uVar4 < 7) {
        iVar12 = 8 - uVar4;
        lVar13 = 1;
        do {
          if (local_98[lVar6 + lVar13] != 0) {
            iVar12 = (int)lVar13;
            uVar10 = uVar4 + iVar12;
            goto LAB_0025603c;
          }
          lVar1 = lVar6 + lVar13;
          lVar13 = lVar13 + 1;
        } while (lVar1 != 7);
        uVar10 = 8;
      }
LAB_0025603c:
      if (iVar5 < iVar12) {
        iVar5 = iVar12;
        uVar11 = uVar4;
      }
    }
    uVar4 = uVar10;
  } while ((int)uVar10 < 8);
  local_80 = len;
  if (iVar5 < 2) {
    uVar11 = 0xffffffff;
  }
  pcVar15 = local_78;
  uVar4 = 0;
  do {
    uVar7 = (ulong)(int)uVar4;
    if ((local_98[uVar7] == 0) && (uVar11 == uVar4)) {
      if (uVar4 == 0) {
        *pcVar15 = ':';
        pcVar15 = pcVar15 + 1;
      }
      *pcVar15 = ':';
      pcVar15 = pcVar15 + 1;
      if ((int)uVar4 < 8) {
        do {
          if (local_98[uVar7] != 0) goto LAB_002560e7;
          uVar7 = uVar7 + 1;
        } while (uVar7 != 8);
        uVar7 = 8;
      }
      else {
LAB_002560e4:
        uVar7 = (ulong)uVar4;
      }
    }
    else {
      evutil_snprintf(pcVar15,(size_t)(local_38 + -(long)pcVar15),"%x");
      sVar8 = strlen(pcVar15);
      pcVar15 = pcVar15 + sVar8;
      uVar7 = 8;
      if (uVar4 != 7) {
        *pcVar15 = ':';
        pcVar15 = pcVar15 + 1;
        uVar4 = uVar4 + 1;
        goto LAB_002560e4;
      }
    }
LAB_002560e7:
    uVar4 = (uint)uVar7;
  } while ((int)uVar4 < 8);
  *pcVar15 = '\0';
  uVar7 = strlen(local_78);
  len = local_80;
LAB_00256162:
  if (len < uVar7) {
    return (char *)0x0;
  }
  event_strlcpy_(dst,local_78,len);
  return dst;
}

Assistant:

const char *
evutil_inet_ntop(int af, const void *src, char *dst, size_t len)
{
#if defined(EVENT__HAVE_INET_NTOP) && !defined(USE_INTERNAL_NTOP)
	return inet_ntop(af, src, dst, len);
#else
	if (af == AF_INET) {
		const struct in_addr *in = src;
		const ev_uint32_t a = ntohl(in->s_addr);
		int r;
		r = evutil_snprintf(dst, len, "%d.%d.%d.%d",
		    (int)(ev_uint8_t)((a>>24)&0xff),
		    (int)(ev_uint8_t)((a>>16)&0xff),
		    (int)(ev_uint8_t)((a>>8 )&0xff),
		    (int)(ev_uint8_t)((a    )&0xff));
		if (r<0||(size_t)r>=len)
			return NULL;
		else
			return dst;
#ifdef AF_INET6
	} else if (af == AF_INET6) {
		const struct in6_addr *addr = src;
		char buf[64], *cp;
		int longestGapLen = 0, longestGapPos = -1, i,
			curGapPos = -1, curGapLen = 0;
		ev_uint16_t words[8];
		for (i = 0; i < 8; ++i) {
			words[i] =
			    (((ev_uint16_t)addr->s6_addr[2*i])<<8) + addr->s6_addr[2*i+1];
		}
		if (words[0] == 0 && words[1] == 0 && words[2] == 0 && words[3] == 0 &&
		    words[4] == 0 && ((words[5] == 0 && words[6] && words[7]) ||
			(words[5] == 0xffff))) {
			/* This is an IPv4 address. */
			if (words[5] == 0) {
				evutil_snprintf(buf, sizeof(buf), "::%d.%d.%d.%d",
				    addr->s6_addr[12], addr->s6_addr[13],
				    addr->s6_addr[14], addr->s6_addr[15]);
			} else {
				evutil_snprintf(buf, sizeof(buf), "::%x:%d.%d.%d.%d", words[5],
				    addr->s6_addr[12], addr->s6_addr[13],
				    addr->s6_addr[14], addr->s6_addr[15]);
			}
			if (strlen(buf) > len)
				return NULL;
			strlcpy(dst, buf, len);
			return dst;
		}
		i = 0;
		while (i < 8) {
			if (words[i] == 0) {
				curGapPos = i++;
				curGapLen = 1;
				while (i<8 && words[i] == 0) {
					++i; ++curGapLen;
				}
				if (curGapLen > longestGapLen) {
					longestGapPos = curGapPos;
					longestGapLen = curGapLen;
				}
			} else {
				++i;
			}
		}
		if (longestGapLen<=1)
			longestGapPos = -1;

		cp = buf;
		for (i = 0; i < 8; ++i) {
			if (words[i] == 0 && longestGapPos == i) {
				if (i == 0)
					*cp++ = ':';
				*cp++ = ':';
				while (i < 8 && words[i] == 0)
					++i;
				--i; /* to compensate for loop increment. */
			} else {
				evutil_snprintf(cp,
								sizeof(buf)-(cp-buf), "%x", (unsigned)words[i]);
				cp += strlen(cp);
				if (i != 7)
					*cp++ = ':';
			}
		}
		*cp = '\0';
		if (strlen(buf) > len)
			return NULL;
		strlcpy(dst, buf, len);
		return dst;
#endif
	} else {
		return NULL;
	}
#endif
}